

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_expect_true(mpack_reader_t *reader)

{
  _Bool _Var1;
  
  _Var1 = mpack_expect_bool(reader);
  if ((!_Var1) && (reader->error == mpack_ok)) {
    reader->error = mpack_error_type;
    reader->end = reader->data;
    if (reader->error_fn != (mpack_reader_error_t)0x0) {
      (*reader->error_fn)(reader,mpack_error_type);
      return;
    }
  }
  return;
}

Assistant:

void mpack_expect_true(mpack_reader_t* reader) {
    if (mpack_expect_bool(reader) != true)
        mpack_reader_flag_error(reader, mpack_error_type);
}